

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cOHz.cpp
# Opt level: O0

void __thiscall OpenMD::COHZ::postCorrelate(COHZ *this)

{
  reference pvVar1;
  reference pvVar2;
  reference this_00;
  long in_RDI;
  Vector<double,_4U> *this_01;
  uint j;
  uint i;
  double in_stack_ffffffffffffffd8;
  undefined4 local_10;
  undefined4 local_c;
  
  for (local_c = 0; local_c < *(uint *)(in_RDI + 0x38); local_c = local_c + 1) {
    for (local_10 = 0; local_10 < *(uint *)(in_RDI + 0xe70); local_10 = local_10 + 1) {
      pvVar1 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             *)(in_RDI + 0xee8),(ulong)local_c);
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](pvVar1,(ulong)local_10);
      if (0 < *pvVar2) {
        pvVar1 = std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               *)(in_RDI + 0xee8),(ulong)local_c);
        pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](pvVar1,(ulong)local_10);
        this_01 = (Vector<double,_4U> *)(double)*pvVar2;
        this_00 = std::
                  vector<std::vector<OpenMD::Vector<double,_4U>,_std::allocator<OpenMD::Vector<double,_4U>_>_>,_std::allocator<std::vector<OpenMD::Vector<double,_4U>,_std::allocator<OpenMD::Vector<double,_4U>_>_>_>_>
                  ::operator[]((vector<std::vector<OpenMD::Vector<double,_4U>,_std::allocator<OpenMD::Vector<double,_4U>_>_>,_std::allocator<std::vector<OpenMD::Vector<double,_4U>,_std::allocator<OpenMD::Vector<double,_4U>_>_>_>_>
                                *)(in_RDI + 0xed0),(ulong)local_c);
        std::vector<OpenMD::Vector<double,_4U>,_std::allocator<OpenMD::Vector<double,_4U>_>_>::
        operator[](this_00,(ulong)local_10);
        Vector<double,_4U>::operator/=(this_01,in_stack_ffffffffffffffd8);
      }
    }
  }
  return;
}

Assistant:

void COHZ::postCorrelate() {
    for (unsigned int i = 0; i < nTimeBins_; ++i) {
      for (unsigned int j = 0; j < nZBins_; ++j) {
        if (counts_[i][j] > 0) { histogram_[i][j] /= counts_[i][j]; }
      }
    }
  }